

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx::create_pipeline
          (DeconvolutionDepthWise_x86_avx *this,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  int _h;
  int *piVar3;
  Allocator *pAVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  ulong uVar10;
  int iVar11;
  char cVar12;
  int _w;
  ulong uVar13;
  Mat local_c8;
  Mat local_78;
  
  if ((this->super_DeconvolutionDepthWise).dynamic_weight == 0) {
    uVar13 = (long)(this->super_DeconvolutionDepthWise).kernel_h *
             (long)(this->super_DeconvolutionDepthWise).kernel_w;
    uVar6 = (this->super_DeconvolutionDepthWise).num_output;
    uVar2 = (this->super_DeconvolutionDepthWise).group;
    uVar10 = (long)(this->super_DeconvolutionDepthWise).weight_data_size / (long)(int)uVar2;
    _w = (int)uVar13;
    uVar10 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) / (long)_w;
    if ((uVar2 == uVar6) &&
       (uVar6 = (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
                     (long)((int)uVar6 / (int)uVar2)) * uVar2, uVar6 == uVar2)) {
      cVar12 = '\x01';
      if (opt->use_packing_layout == true) {
        cVar12 = '\b';
        if ((uVar6 & 7) != 0) {
          cVar12 = ((uVar6 & 3) == 0) * '\x03' + '\x01';
        }
      }
      pMVar1 = &(this->super_DeconvolutionDepthWise).weight_data;
      local_78.cstep = 0;
      local_78.data = (Allocator *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elempack = 0;
      local_78._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
      iVar11 = 0;
      local_78.elemsize._4_4_ = (int)local_78.refcount;
      local_78.allocator = (Allocator *)local_78.data;
      local_78.dims = (int)local_78.refcount;
      local_78.w = local_78.refcount._4_4_;
      local_78.c = local_78.elempack;
      Mat::create(&local_78,(this->super_DeconvolutionDepthWise).weight_data.w,4,(Allocator *)0x0);
      _h = (this->super_DeconvolutionDepthWise).group;
      iVar7 = (uVar6 - (int)uVar6 % _h) * ((this->super_DeconvolutionDepthWise).num_output / _h);
      if (0 < iVar7) {
        pvVar5 = pMVar1->data;
        puVar8 = (undefined4 *)((long)local_78.data + uVar13 * 4 + -4);
        do {
          if (0 < _w) {
            uVar10 = 0;
            puVar9 = puVar8;
            do {
              *puVar9 = *(undefined4 *)((long)pvVar5 + uVar10 * 4);
              uVar10 = uVar10 + 1;
              puVar9 = puVar9 + -1;
            } while ((uVar13 & 0xffffffff) != uVar10);
          }
          iVar11 = iVar11 + 1;
          pvVar5 = (void *)((long)pvVar5 + uVar13 * 4);
          puVar8 = puVar8 + uVar13;
        } while (iVar11 != iVar7);
      }
      if (cVar12 == '\x01') {
        if (&this->weight_data_tm != &local_78) {
          piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = (this->weight_data_tm).refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar5 = (this->weight_data_tm).data;
              pAVar4 = (this->weight_data_tm).allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
          (this->weight_data_tm).data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          (this->weight_data_tm).c = 0;
          (this->weight_data_tm).data = local_78.data;
          (this->weight_data_tm).refcount =
               (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
          (this->weight_data_tm).elemsize =
               CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
          (this->weight_data_tm).elempack = local_78.elempack;
          (this->weight_data_tm).allocator = local_78.allocator;
          (this->weight_data_tm).dims = local_78.dims;
          (this->weight_data_tm).w = local_78.w;
          (this->weight_data_tm).h = local_78.h;
          (this->weight_data_tm).d = local_78.d;
          (this->weight_data_tm).c = local_78.c;
          (this->weight_data_tm).cstep = local_78.cstep;
        }
      }
      else if (cVar12 == '\x04') {
        Mat::reshape(&local_c8,&local_78,_w,(this->super_DeconvolutionDepthWise).group,
                     (Allocator *)0x0);
        convert_packing(&local_c8,&this->weight_data_tm,4,opt);
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else if (cVar12 == '\b') {
        Mat::reshape(&local_c8,&local_78,_w,_h,(Allocator *)0x0);
        convert_packing(&local_c8,&this->weight_data_tm,8,opt);
        if (local_c8.refcount != (int *)0x0) {
          LOCK();
          *local_c8.refcount = *local_c8.refcount + -1;
          UNLOCK();
          if (*local_c8.refcount == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      if (opt->lightmode == true) {
        piVar3 = (this->super_DeconvolutionDepthWise).weight_data.refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar5 = (this->super_DeconvolutionDepthWise).weight_data.data;
            pAVar4 = (this->super_DeconvolutionDepthWise).weight_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_DeconvolutionDepthWise).weight_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->super_DeconvolutionDepthWise).weight_data.refcount = (int *)0x0;
        (this->super_DeconvolutionDepthWise).weight_data.dims = 0;
        (this->super_DeconvolutionDepthWise).weight_data.w = 0;
        (this->super_DeconvolutionDepthWise).weight_data.h = 0;
        (this->super_DeconvolutionDepthWise).weight_data.d = 0;
        (this->super_DeconvolutionDepthWise).weight_data.c = 0;
      }
      piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_78.data != (Allocator *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      create_group_ops(this,opt);
      if (opt->lightmode == true) {
        piVar3 = (this->super_DeconvolutionDepthWise).weight_data.refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar5 = (this->super_DeconvolutionDepthWise).weight_data.data;
            pAVar4 = (this->super_DeconvolutionDepthWise).weight_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_DeconvolutionDepthWise).weight_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.elemsize + 4) = 0;
        (this->super_DeconvolutionDepthWise).weight_data.data = (void *)0x0;
        (this->super_DeconvolutionDepthWise).weight_data.refcount = (int *)0x0;
        (this->super_DeconvolutionDepthWise).weight_data.dims = 0;
        (this->super_DeconvolutionDepthWise).weight_data.w = 0;
        (this->super_DeconvolutionDepthWise).weight_data.h = 0;
        (this->super_DeconvolutionDepthWise).weight_data.d = 0;
        (this->super_DeconvolutionDepthWise).weight_data.c = 0;
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}